

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

int blake2b_init(blake2b_state *S,uint8_t outlen)

{
  byte in_SIL;
  blake2b_param P [1];
  undefined1 auStackY_54 [4];
  undefined1 auStackY_50 [8];
  undefined1 uVar1;
  undefined1 uVar2;
  undefined6 in_stack_ffffffffffffffba;
  blake2b_state *in_stack_ffffffffffffffc0;
  undefined1 auStack_38 [16];
  undefined1 auStack_28 [36];
  int local_4;
  
  if ((in_SIL == 0) || (0x40 < in_SIL)) {
    local_4 = -1;
  }
  else {
    store32(auStackY_54,0);
    store64(auStackY_50,0);
    uVar1 = 0;
    uVar2 = 0;
    memset(&stack0xffffffffffffffba,0,0xe);
    memset(auStack_38,0,0x10);
    memset(auStack_28,0,0x10);
    local_4 = blake2b_init_param(in_stack_ffffffffffffffc0,
                                 (blake2b_param *)
                                 CONCAT62(in_stack_ffffffffffffffba,CONCAT11(uVar2,uVar1)));
  }
  return local_4;
}

Assistant:

int blake2b_init( blake2b_state *S, const uint8_t outlen )
{
  blake2b_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2B_OUTBYTES ) ) return -1;

  P->digest_length = outlen;
  P->key_length    = 0;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store64( &P->node_offset, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  memset( P->reserved, 0, sizeof( P->reserved ) );
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2b_init_param( S, P );
}